

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadAffineSpace3faArray
          (avector<AffineSpace3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Vector *pVVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Vector VVar14;
  int iVar15;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar16;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar17;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar18;
  runtime_error *this_01;
  long *plVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  XMLLoader *this_02;
  ulong uVar23;
  long lVar24;
  size_t sVar25;
  size_t *psVar26;
  Ref<embree::XML> child;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  temp;
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr local_98;
  size_t sStack_90;
  _Base_ptr local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  pointer local_68;
  pointer pRStack_60;
  pointer local_58;
  pointer pTStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_40;
  
  if (xml->ptr == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    iVar15 = std::__cxx11::string::compare((char *)&xml->ptr->name);
    if (iVar15 == 0) {
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      this_02 = (XMLLoader *)xml->ptr;
      if ((_Base_ptr)(this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar20 = 0;
        uVar22 = 0;
      }
      else {
        local_80 = (_Base_ptr)&__return_storage_ptr__->size_active;
        uVar20 = 0;
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar23 = 0;
        do {
          XML::child((XML *)local_e8,(size_t)this_02);
          load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                    ((AffineSpace3fa *)(local_e8 + 0x20),this_02,(Ref<embree::XML> *)local_e8);
          uVar22 = uVar20;
          if (uVar20 <= uVar23) {
            if (uVar20 == 0) {
              uVar22 = uVar23 + 1;
            }
            else {
              do {
                uVar22 = uVar22 * 2 + (ulong)(uVar22 * 2 == 0);
              } while (uVar22 <= uVar23);
            }
          }
          local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8._0_8_;
          paStack_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_c8._8_8_;
          local_58 = (pointer)local_b8._M_allocated_capacity;
          pTStack_50 = (pointer)local_b8._8_8_;
          local_68 = (pointer)local_a8._M_allocated_capacity;
          pRStack_60 = (pointer)local_a8._8_8_;
          local_78 = local_98;
          uStack_70 = sStack_90;
          if (uVar20 != uVar22) {
            pAVar18 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      alignedMalloc(uVar22 << 6,0x10);
            if (uVar23 != 0) {
              lVar24 = 0x30;
              uVar20 = uVar23;
              do {
                puVar2 = (undefined8 *)((long)pAVar16 + lVar24 + -0x30);
                uVar8 = puVar2[1];
                puVar3 = (undefined8 *)((long)pAVar18 + lVar24 + -0x30);
                *puVar3 = *puVar2;
                puVar3[1] = uVar8;
                puVar2 = (undefined8 *)((long)pAVar16 + lVar24 + -0x20);
                uVar8 = puVar2[1];
                puVar3 = (undefined8 *)((long)pAVar18 + lVar24 + -0x20);
                *puVar3 = *puVar2;
                puVar3[1] = uVar8;
                puVar2 = (undefined8 *)((long)pAVar16 + lVar24 + -0x10);
                uVar8 = puVar2[1];
                puVar3 = (undefined8 *)((long)pAVar18 + lVar24 + -0x10);
                *puVar3 = *puVar2;
                puVar3[1] = uVar8;
                puVar2 = (undefined8 *)((long)&(pAVar16->l).vx.field_0 + lVar24);
                uVar8 = puVar2[1];
                puVar3 = (undefined8 *)((long)&(pAVar18->l).vx.field_0 + lVar24);
                *puVar3 = *puVar2;
                puVar3[1] = uVar8;
                lVar24 = lVar24 + 0x40;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
            alignedFree(pAVar16);
            uVar20 = uVar22;
            pAVar16 = pAVar18;
          }
          uVar22 = uVar23 + 1;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&pAVar16[uVar23].l.vx.field_0 = local_48;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)((long)&pAVar16[uVar23].l.vx.field_0 + 8) = paStack_40;
          pVVar4 = &pAVar16[uVar23].l.vy;
          *(pointer *)&pVVar4->field_0 = local_58;
          *(pointer *)((long)&pVVar4->field_0 + 8) = pTStack_50;
          pVVar4 = &pAVar16[uVar23].l.vz;
          *(pointer *)&pVVar4->field_0 = local_68;
          *(pointer *)((long)&pVVar4->field_0 + 8) = pRStack_60;
          pVVar4 = &pAVar16[uVar23].p;
          (pVVar4->field_0).m128[0] = (float)local_78;
          (pVVar4->field_0).m128[1] = local_78._4_4_;
          (pVVar4->field_0).m128[2] = (float)uStack_70;
          (pVVar4->field_0).m128[3] = uStack_70._4_4_;
          if ((long *)local_e8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_e8._0_8_ + 0x18))();
          }
          this_02 = (XMLLoader *)xml->ptr;
          uVar23 = uVar22;
        } while (uVar22 < (ulong)((long)((this_02->id2node)._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count -
                                        (long)(this_02->id2node)._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_right) >> 3));
      }
      __return_storage_ptr__->size_active = uVar22;
      __return_storage_ptr__->size_alloced = uVar20;
      __return_storage_ptr__->items = pAVar16;
    }
    else {
      this_00 = xml->ptr;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"ofs","");
      XML::parm((string *)(local_e8 + 0x20),this_00,(string *)local_e8);
      iVar15 = std::__cxx11::string::compare(local_e8 + 0x20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_);
      }
      if (iVar15 == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)local_e8,&xml->ptr->loc);
        plVar19 = (long *)std::__cxx11::string::append(local_e8);
        local_c8._0_8_ = *plVar19;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ == paVar21) {
          local_b8._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_b8._8_8_ = plVar19[3];
          local_c8._0_8_ = &local_b8;
        }
        else {
          local_b8._M_allocated_capacity = paVar21->_M_allocated_capacity;
        }
        local_c8._8_8_ = plVar19[1];
        *plVar19 = (long)paVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)(local_e8 + 0x20));
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadBinary<std::vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>,std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>>>>
                ((vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  *)(local_e8 + 0x20),this,xml);
      psVar26 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      lVar24 = (long)(local_c8._8_8_ - local_c8._0_8_) >> 4;
      sVar25 = lVar24 * -0x5555555555555555;
      if (local_c8._8_8_ != local_c8._0_8_) {
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  alignedMalloc(lVar24 * -0x5555555555555540,0x10);
        __return_storage_ptr__->items = pAVar16;
        alignedFree((void *)0x0);
        *psVar26 = sVar25;
        psVar26 = &__return_storage_ptr__->size_alloced;
      }
      *psVar26 = sVar25;
      if (local_c8._8_8_ != local_c8._0_8_) {
        paVar17 = &(__return_storage_ptr__->items->p).field_0;
        lVar24 = 0x28;
        uVar22 = 0;
        do {
          uVar8 = *(undefined8 *)(local_c8._0_8_ + lVar24 + -0x24);
          uVar9 = *(undefined8 *)(local_c8._0_8_ + lVar24 + -0x18);
          uVar5 = *(undefined4 *)(local_c8._0_8_ + lVar24 + -0x1c);
          uVar10 = *(undefined8 *)(local_c8._0_8_ + lVar24 + -0xc);
          uVar6 = *(undefined4 *)
                   (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_c8._0_8_ + -0x10))->_M_local_buf + lVar24);
          uVar11 = *(undefined8 *)(local_c8._0_8_ + lVar24);
          uVar7 = *(undefined4 *)(local_c8._0_8_ + lVar24 + -4);
          paVar1 = paVar17 + -3;
          *(float *)paVar1 = (float)*(undefined4 *)(local_c8._0_8_ + lVar24 + -0x28);
          *(int *)((long)paVar1 + 4) = (int)uVar8;
          *(int *)((long)paVar1 + 8) = (int)((ulong)uVar8 >> 0x20);
          *(undefined4 *)((long)paVar1 + 0xc) = 0;
          aVar12.m128[1] = (float)(int)uVar9;
          aVar12.m128[0] = (float)uVar5;
          aVar12.m128[2] = (float)(int)((ulong)uVar9 >> 0x20);
          aVar12.m128[3] = 0.0;
          paVar17[-2] = aVar12;
          aVar13.m128[1] = (float)(int)uVar10;
          aVar13.m128[0] = (float)uVar6;
          aVar13.m128[2] = (float)(int)((ulong)uVar10 >> 0x20);
          aVar13.m128[3] = 0.0;
          paVar17[-1] = aVar13;
          VVar14.field_0.m128[1] = (float)(int)uVar11;
          VVar14.field_0.m128[0] = (float)uVar7;
          VVar14.field_0.m128[2] = (float)(int)((ulong)uVar11 >> 0x20);
          VVar14.field_0.m128[3] = 0.0;
          *paVar17 = VVar14.field_0;
          uVar22 = uVar22 + 1;
          paVar17 = paVar17 + 4;
          lVar24 = lVar24 + 0x30;
        } while (uVar22 < (ulong)(((long)(local_c8._8_8_ - local_c8._0_8_) >> 4) *
                                 -0x5555555555555555));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadAffineSpace3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "AffineSpaceArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        AffineSpace3ff space = AffineSpace3ff(load<AffineSpace3fa>(child));
        spaceArray.push_back(space);
      }
      return spaceArray;
    }
    else if (xml->parm("ofs") != "") {
      std::vector<AffineSpace3f> temp = loadBinary<std::vector<AffineSpace3f>>(xml);
      avector<AffineSpace3ff> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = AffineSpace3ff(AffineSpace3fa(temp[i]));
      return data;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid AffineSpace3fa array");
  }